

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

void __thiscall llvm::DWARFUnit::clearDIEs(DWARFUnit *this,bool KeepCUDie)

{
  size_type sVar1;
  bool KeepCUDie_local;
  DWARFUnit *this_local;
  
  sVar1 = std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>::size
                    (&this->DieArray);
  if (KeepCUDie < sVar1) {
    std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>::resize
              (&this->DieArray,(ulong)KeepCUDie);
    std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>::
    shrink_to_fit(&this->DieArray);
  }
  return;
}

Assistant:

void DWARFUnit::clearDIEs(bool KeepCUDie) {
  if (DieArray.size() > (unsigned)KeepCUDie) {
    DieArray.resize((unsigned)KeepCUDie);
    DieArray.shrink_to_fit();
  }
}